

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O2

bool __thiscall irr::scene::CMeshCache::renameMesh(CMeshCache *this,IMesh *mesh,path *name)

{
  undefined1 *this_00;
  IMesh *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  u32 i;
  ulong uVar5;
  long lVar6;
  
  this_00 = &(this->super_IMeshCache).field_0x8;
  lVar6 = 0;
  uVar5 = 0;
  do {
    lVar4 = *(long *)&(this->super_IMeshCache).field_0x8;
    uVar3 = (*(long *)&(this->super_IMeshCache).field_0x10 - lVar4) / 0x48 & 0xffffffff;
    if (uVar3 <= uVar5) {
LAB_001e9b3d:
      return uVar5 < uVar3;
    }
    pIVar1 = *(IMesh **)(lVar4 + 0x40 + lVar6);
    if (pIVar1 == mesh) {
LAB_001e9b26:
      irr::io::SNamedPath::setPath((SNamedPath *)(lVar4 + lVar6),name);
      core::array<irr::scene::CMeshCache::MeshEntry>::sort
                ((array<irr::scene::CMeshCache::MeshEntry> *)this_00);
      goto LAB_001e9b3d;
    }
    if (pIVar1 != (IMesh *)0x0) {
      iVar2 = (*pIVar1->_vptr_IMesh[0xd])(pIVar1,0,0xff,0xffffffff,0xffffffff);
      if ((IMesh *)CONCAT44(extraout_var,iVar2) == mesh) {
        lVar4 = *(long *)this_00;
        goto LAB_001e9b26;
      }
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x48;
  } while( true );
}

Assistant:

bool CMeshCache::renameMesh(const IMesh *const mesh, const io::path &name)
{
	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh)) {
			Meshes[i].NamedPath.setPath(name);
			Meshes.sort();
			return true;
		}
	}

	return false;
}